

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGValidStatePtr
xmlRelaxNGCopyValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidStatePtr state)

{
  int iVar1;
  xmlRelaxNGStatesPtr pxVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  xmlRelaxNGValidStatePtr pxVar14;
  xmlAttrPtr *ppxVar15;
  
  if (state == (xmlRelaxNGValidStatePtr)0x0) {
LAB_0018c2bb:
    pxVar14 = (xmlRelaxNGValidStatePtr)0x0;
  }
  else {
    pxVar2 = ctxt->freeState;
    if (pxVar2 == (xmlRelaxNGStatesPtr)0x0) {
LAB_0018c219:
      pxVar14 = (xmlRelaxNGValidStatePtr)(*xmlMalloc)(0x38);
      if (pxVar14 == (xmlRelaxNGValidStatePtr)0x0) {
        xmlRngVErrMemory(ctxt);
        goto LAB_0018c2bb;
      }
      pxVar14->value = (xmlChar *)0x0;
      pxVar14->endvalue = (xmlChar *)0x0;
      pxVar14->nbAttrs = 0;
      pxVar14->maxAttrs = 0;
      *(undefined8 *)&pxVar14->nbAttrLeft = 0;
      pxVar14->node = (xmlNodePtr)0x0;
      pxVar14->seq = (xmlNodePtr)0x0;
      pxVar14->attrs = (xmlAttrPtr *)0x0;
    }
    else {
      iVar1 = pxVar2->nbState;
      if ((long)iVar1 < 1) goto LAB_0018c219;
      pxVar2->nbState = iVar1 + -1;
      pxVar14 = pxVar2->tabState[(long)iVar1 + -1];
    }
    ppxVar15 = pxVar14->attrs;
    iVar1 = pxVar14->maxAttrs;
    pxVar14->attrs = state->attrs;
    uVar3 = *(undefined4 *)&state->node;
    uVar4 = *(undefined4 *)((long)&state->node + 4);
    uVar5 = *(undefined4 *)&state->seq;
    uVar6 = *(undefined4 *)((long)&state->seq + 4);
    iVar7 = state->maxAttrs;
    iVar8 = state->nbAttrLeft;
    uVar9 = *(undefined4 *)&state->field_0x1c;
    uVar10 = *(undefined4 *)&state->value;
    uVar11 = *(undefined4 *)((long)&state->value + 4);
    uVar12 = *(undefined4 *)&state->endvalue;
    uVar13 = *(undefined4 *)((long)&state->endvalue + 4);
    pxVar14->nbAttrs = state->nbAttrs;
    pxVar14->maxAttrs = iVar7;
    pxVar14->nbAttrLeft = iVar8;
    *(undefined4 *)&pxVar14->field_0x1c = uVar9;
    *(undefined4 *)&pxVar14->node = uVar3;
    *(undefined4 *)((long)&pxVar14->node + 4) = uVar4;
    *(undefined4 *)&pxVar14->seq = uVar5;
    *(undefined4 *)((long)&pxVar14->seq + 4) = uVar6;
    *(undefined4 *)&pxVar14->value = uVar10;
    *(undefined4 *)((long)&pxVar14->value + 4) = uVar11;
    *(undefined4 *)&pxVar14->endvalue = uVar12;
    *(undefined4 *)((long)&pxVar14->endvalue + 4) = uVar13;
    pxVar14->attrs = ppxVar15;
    pxVar14->maxAttrs = iVar1;
    if (0 < state->nbAttrs) {
      if (ppxVar15 == (xmlAttrPtr *)0x0) {
        iVar1 = state->maxAttrs;
        pxVar14->maxAttrs = iVar1;
        ppxVar15 = (xmlAttrPtr *)(*xmlMalloc)((long)iVar1 << 3);
        pxVar14->attrs = ppxVar15;
        if (ppxVar15 == (xmlAttrPtr *)0x0) {
          xmlRngVErrMemory(ctxt);
          pxVar14->nbAttrs = 0;
          return pxVar14;
        }
      }
      else if (iVar1 < state->nbAttrs) {
        ppxVar15 = (xmlAttrPtr *)(*xmlRealloc)(ppxVar15,(long)state->maxAttrs << 3);
        if (ppxVar15 == (xmlAttrPtr *)0x0) {
          xmlRngVErrMemory(ctxt);
          pxVar14->nbAttrs = 0;
          return pxVar14;
        }
        pxVar14->maxAttrs = state->maxAttrs;
        pxVar14->attrs = ppxVar15;
      }
      memcpy(pxVar14->attrs,state->attrs,(long)state->nbAttrs << 3);
    }
  }
  return pxVar14;
}

Assistant:

static xmlRelaxNGValidStatePtr
xmlRelaxNGCopyValidState(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidStatePtr state)
{
    xmlRelaxNGValidStatePtr ret;
    unsigned int maxAttrs;
    xmlAttrPtr *attrs;

    if (state == NULL)
        return (NULL);
    if ((ctxt->freeState != NULL) && (ctxt->freeState->nbState > 0)) {
        ctxt->freeState->nbState--;
        ret = ctxt->freeState->tabState[ctxt->freeState->nbState];
    } else {
        ret =
            (xmlRelaxNGValidStatePtr)
            xmlMalloc(sizeof(xmlRelaxNGValidState));
        if (ret == NULL) {
            xmlRngVErrMemory(ctxt);
            return (NULL);
        }
        memset(ret, 0, sizeof(xmlRelaxNGValidState));
    }
    attrs = ret->attrs;
    maxAttrs = ret->maxAttrs;
    memcpy(ret, state, sizeof(xmlRelaxNGValidState));
    ret->attrs = attrs;
    ret->maxAttrs = maxAttrs;
    if (state->nbAttrs > 0) {
        if (ret->attrs == NULL) {
            ret->maxAttrs = state->maxAttrs;
            ret->attrs = (xmlAttrPtr *) xmlMalloc(ret->maxAttrs *
                                                  sizeof(xmlAttrPtr));
            if (ret->attrs == NULL) {
                xmlRngVErrMemory(ctxt);
                ret->nbAttrs = 0;
                return (ret);
            }
        } else if (ret->maxAttrs < state->nbAttrs) {
            xmlAttrPtr *tmp;

            tmp = (xmlAttrPtr *) xmlRealloc(ret->attrs, state->maxAttrs *
                                            sizeof(xmlAttrPtr));
            if (tmp == NULL) {
                xmlRngVErrMemory(ctxt);
                ret->nbAttrs = 0;
                return (ret);
            }
            ret->maxAttrs = state->maxAttrs;
            ret->attrs = tmp;
        }
        memcpy(ret->attrs, state->attrs,
               state->nbAttrs * sizeof(xmlAttrPtr));
    }
    return (ret);
}